

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Global::Mark(Global *this,Store *store)

{
  bool bVar1;
  Store *store_local;
  Global *this_local;
  
  bVar1 = IsReference((ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc);
  if (bVar1) {
    Store::Mark(store,(Ref)(this->value_).ref_.index);
  }
  return;
}

Assistant:

void Global::Mark(Store& store) {
  if (IsReference(type_.type)) {
    store.Mark(value_.ref_);
  }
}